

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O3

string * __thiscall
testing::internal::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,type_info *type)

{
  int iVar1;
  char *__ptr;
  long lVar2;
  char *__s;
  int status;
  string name_str;
  allocator<char> local_69;
  _Alloc_hider local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  int local_44;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  __s = *(char **)(this + 8) + (**(char **)(this + 8) == '*');
  local_44 = 0;
  __ptr = (char *)__cxa_demangle(__s,0,0,&local_44);
  if (local_44 == 0) {
    __s = __ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_69);
  free(__ptr);
  local_68._M_p = &local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_40,local_38 + (long)local_40);
  iVar1 = std::__cxx11::string::compare((ulong)&local_68,0,&DAT_00000007);
  if (iVar1 == 0) {
    lVar2 = std::__cxx11::string::find((char *)&local_68,0x141d3c,7);
    if (lVar2 != -1) {
      std::__cxx11::string::erase((ulong)&local_68,3);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_68._M_p == &local_58) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
  }
  __return_storage_ptr__->_M_string_length = local_60;
  local_60 = 0;
  local_58 = '\0';
  if (local_40 != local_30) {
    local_68._M_p = &local_58;
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetTypeName(const std::type_info& type) {
  const char* const name = type.name();
#if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, nullptr, nullptr, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return CanonicalizeForStdLibVersioning(name_str);
#else
  return name;
#endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC
}